

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

parasail_result_t * parasail_result_new_table1(int a,int b)

{
  void *pvVar1;
  size_t __size;
  size_t _size_1;
  size_t _size;
  parasail_result_t *result;
  int b_local;
  int a_local;
  
  if ((a < 1) || (b < 1)) {
    fprintf(_stderr,"%s: inputs must be > 0\n","parasail_result_new_table1");
    _b_local = (parasail_result_t *)0x0;
  }
  else {
    _b_local = parasail_result_new();
    if (_b_local == (parasail_result_t *)0x0) {
      _b_local = (parasail_result_t *)0x0;
    }
    else {
      pvVar1 = malloc(8);
      (_b_local->field_4).extra = pvVar1;
      if ((_b_local->field_4).extra == (void *)0x0) {
        fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_table1",8);
        _b_local = (parasail_result_t *)0x0;
      }
      else {
        __size = (long)(a * b) << 2;
        pvVar1 = malloc(__size);
        ((_b_local->field_4).trace)->trace_table = pvVar1;
        if (((_b_local->field_4).rowcols)->score_row == (int *)0x0) {
          fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_table1",__size);
          _b_local = (parasail_result_t *)0x0;
        }
      }
    }
  }
  return _b_local;
}

Assistant:

parasail_result_t* parasail_result_new_table1(const int a, const int b)
{
    /* declare all variables */
    parasail_result_t *result = NULL;

    /* validate inputs */
    VALIDATE_A_B
    
    /* allocate struct to hold memory */
    result = parasail_result_new();
    if (!result) return NULL;

    /* allocate only score table */
    PARASAIL_NEW(result->tables, parasail_result_extra_tables_t);
    PARASAIL_CALLOC(result->tables->score_table, int, a*b);

    return result;
}